

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::PipelineCache>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Resources *this;
  RefData<vk::Handle<(vk::HandleType)15>_> data;
  allocator<char> local_f1;
  string local_f0;
  Move<vk::Handle<(vk::HandleType)15>_> local_c0;
  RefData<vk::Handle<(vk::HandleType)15>_> local_a0;
  undefined1 local_80 [8];
  Unique<vk::Handle<(vk::HandleType)15>_> obj;
  undefined1 local_58 [7];
  Resources res;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  local_10 = __return_storage_ptr__;
  Environment::Environment((Environment *)local_58,context,1);
  this = (Resources *)
         ((long)&obj.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator + 7);
  PipelineCache::Resources::Resources
            (this,(Environment *)local_58,(Parameters *)((long)&context_local + 7));
  PipelineCache::create
            (&local_c0,(Environment *)local_58,this,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a0,(Move *)&local_c0);
  data.deleter.m_deviceIface = local_a0.deleter.m_deviceIface;
  data.object.m_internal = local_a0.object.m_internal;
  data.deleter.m_device = local_a0.deleter.m_device;
  data.deleter.m_allocator = local_a0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)15>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)15>_> *)local_80,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::~Move(&local_c0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)15>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)15>_> *)local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Ok",&local_f1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}